

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  int iVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  roaring_array_t *ra;
  container_t *pcVar6;
  uint16_t *puVar7;
  array_container_t *ac;
  run_container_t *dst;
  array_container_t *dst_00;
  roaring_bitmap_t *prVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  array_container_t *src_2;
  array_container_t *paVar10;
  roaring_array_t *sa;
  uint16_t uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint8_t result_type;
  uint8_t type2;
  uint8_t local_71;
  byte local_70;
  byte local_6f;
  ushort local_6e;
  uint local_6c;
  array_container_t *local_68;
  roaring_array_t *local_60;
  ulong local_58;
  ulong local_50;
  undefined4 local_44;
  ulong local_40;
  array_container_t *local_38;
  
  local_71 = '\0';
  uVar14 = (x1->high_low_container).size;
  local_50 = (ulong)uVar14;
  prVar8 = x2;
  if (uVar14 != 0) {
    uVar9 = (x2->high_low_container).size;
    prVar8 = x1;
    if (uVar9 != 0) {
      local_44 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      ra = &roaring_bitmap_create_with_capacity(uVar14 + uVar9)->high_low_container;
      local_6c = 0;
      bVar3 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar3 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar3;
      puVar7 = (x1->high_low_container).keys;
      uVar11 = *(x2->high_low_container).keys;
      local_40 = (ulong)(uVar9 - 1);
      uVar13 = 0;
      local_60 = &x1->high_low_container;
      local_58 = (ulong)uVar9;
LAB_00114c7e:
      do {
        local_6e = *puVar7;
        uVar13 = (ulong)(int)uVar13;
        while( true ) {
          sa = local_60;
          uVar14 = local_6c;
          iVar12 = (int)uVar13;
          if (local_6e == uVar11) break;
          if (local_6e < uVar11) {
            local_70 = local_60->typecodes[local_6c & 0xffff];
            pcVar6 = get_copy_of_container
                               (local_60->containers[local_6c & 0xffff],&local_70,
                                (_Bool)(local_60->flags & 1));
            if ((sa->flags & 1) != 0) {
              if (sa->size <= (int)uVar14) goto LAB_001151f5;
              sa->containers[(int)uVar14] = pcVar6;
              sa->typecodes[(int)uVar14] = local_70;
            }
            local_68 = (array_container_t *)CONCAT71(local_68._1_7_,local_70);
            extend_array(ra,1);
            iVar12 = ra->size;
            ra->keys[iVar12] = local_6e;
            ra->containers[iVar12] = pcVar6;
            ra->typecodes[iVar12] = (uint8_t)local_68;
            ra->size = ra->size + 1;
            uVar14 = uVar14 + 1;
            if (uVar14 == (uint)local_50) goto LAB_00115193;
            puVar7 = (uint16_t *)((ulong)((uVar14 & 0xffff) * 2) + (long)local_60->keys);
            local_6c = uVar14;
            goto LAB_00114c7e;
          }
          local_6f = (x2->high_low_container).typecodes[uVar13 & 0xffff];
          pcVar6 = get_copy_of_container
                             ((x2->high_low_container).containers[uVar13 & 0xffff],&local_6f,
                              (_Bool)((x2->high_low_container).flags & 1));
          bVar3 = local_6f;
          if (((x2->high_low_container).flags & 1) != 0) {
            if ((x2->high_low_container).size <= iVar12) {
LAB_001151f5:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (x2->high_low_container).containers[uVar13] = pcVar6;
            (x2->high_low_container).typecodes[uVar13] = local_6f;
          }
          extend_array(ra,1);
          iVar1 = ra->size;
          ra->keys[iVar1] = uVar11;
          ra->containers[iVar1] = pcVar6;
          ra->typecodes[iVar1] = bVar3;
          ra->size = ra->size + 1;
          if ((int)local_40 == iVar12) {
            uVar14 = (uint)local_50;
            sa = local_60;
            uVar13 = local_58;
            uVar9 = local_6c;
            goto LAB_0011518f;
          }
          uVar13 = uVar13 + 1;
          uVar11 = (x2->high_low_container).keys[uVar13 & 0xffff];
        }
        local_70 = local_60->typecodes[(ushort)local_6c];
        ac = (array_container_t *)local_60->containers[(ushort)local_6c];
        bVar3 = (x2->high_low_container).typecodes[uVar13 & 0xffff];
        src_2 = (array_container_t *)(x2->high_low_container).containers[uVar13 & 0xffff];
        local_6f = bVar3;
        if ((char)local_44 != '\0') {
          bVar4 = local_70;
          if (local_70 == 4) {
            bVar4 = *(byte *)&ac->array;
          }
          if (bVar4 == 1) goto LAB_00114da4;
          bVar4 = bVar3;
          if (bVar3 == 4) {
            bVar4 = *(byte *)&src_2->array;
          }
          if (bVar4 == 1) goto LAB_00114da4;
          bVar4 = local_70;
          if (local_70 == 4) {
            bVar4 = *(byte *)&ac->array;
            if (bVar4 == 4) {
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1070,
                            "container_t *container_mutable_unwrap_shared(container_t *, uint8_t *)"
                           );
            }
            ac = *(array_container_t **)ac;
          }
          if (bVar4 != 1) {
            if (bVar4 == 3) {
              ac = (array_container_t *)bitset_container_from_run((run_container_t *)ac);
            }
            else {
              local_68 = src_2;
              if (bVar4 != 2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                              ,0x10b0,
                              "bitset_container_t *container_to_bitset(container_t *, uint8_t)");
              }
              ac = (array_container_t *)bitset_container_from_array(ac);
              src_2 = local_68;
            }
          }
          local_70 = 1;
          dst_00 = (array_container_t *)container_lazy_ior(ac,'\x01',src_2,bVar3,&local_71);
          if (dst_00 != ac) {
            container_free(ac,local_70);
          }
          goto LAB_0011506b;
        }
LAB_00114da4:
        bVar4 = local_70;
        if (local_70 == 4) {
          bVar4 = *(byte *)&ac->array;
          if (bVar4 == 4) goto LAB_00115214;
          ac = *(array_container_t **)ac;
        }
        if (bVar3 == 4) {
          bVar3 = *(byte *)&src_2->array;
          if (bVar3 == 4) {
LAB_00115214:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          src_2 = *(array_container_t **)src_2;
        }
        local_38 = (array_container_t *)0x0;
        switch((uint)bVar3 + (uint)bVar4 * 4) {
        case 5:
          dst_00 = (array_container_t *)bitset_container_create();
          bitset_container_or_nocard
                    ((bitset_container_t *)ac,(bitset_container_t *)src_2,
                     (bitset_container_t *)dst_00);
          goto LAB_00115066;
        case 6:
          dst_00 = (array_container_t *)bitset_container_create();
          paVar10 = ac;
          goto LAB_00115028;
        case 7:
          if (((src_2->cardinality == 1) && (*src_2->array == 0)) && (src_2->array[1] == 0xffff)) {
            dst_00 = (array_container_t *)calloc(1,0x10);
            goto LAB_0011516a;
          }
          dst_00 = (array_container_t *)bitset_container_create();
          paVar10 = ac;
LAB_0011505e:
          run_bitset_container_lazy_union
                    ((run_container_t *)src_2,(bitset_container_t *)paVar10,
                     (bitset_container_t *)dst_00);
          goto LAB_00115066;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x14e3,
                        "container_t *container_lazy_or(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                       );
        case 9:
          dst_00 = (array_container_t *)bitset_container_create();
          paVar10 = src_2;
          src_2 = ac;
LAB_00115028:
          array_bitset_container_lazy_union
                    (src_2,(bitset_container_t *)paVar10,(bitset_container_t *)dst_00);
LAB_00115066:
          local_71 = '\x01';
          break;
        case 10:
          _Var5 = array_array_container_lazy_union(ac,src_2,&local_38);
          local_71 = '\x02' - _Var5;
          dst_00 = local_38;
          break;
        case 0xb:
          dst_00 = (array_container_t *)calloc(1,0x10);
          paVar10 = src_2;
          goto LAB_00114ff5;
        case 0xd:
          if (((ac->cardinality != 1) || (*ac->array != 0)) || (ac->array[1] != 0xffff)) {
            dst_00 = (array_container_t *)bitset_container_create();
            paVar10 = src_2;
            src_2 = ac;
            goto LAB_0011505e;
          }
          dst_00 = (array_container_t *)calloc(1,0x10);
          src_2 = ac;
LAB_0011516a:
          local_71 = '\x03';
          run_container_copy((run_container_t *)src_2,(run_container_t *)dst_00);
          break;
        case 0xe:
          dst_00 = (array_container_t *)calloc(1,0x10);
          paVar10 = ac;
          ac = src_2;
LAB_00114ff5:
          array_run_container_union(ac,(run_container_t *)paVar10,(run_container_t *)dst_00);
          local_71 = '\x03';
          break;
        case 0xf:
          local_68 = src_2;
          dst = (run_container_t *)calloc(1,0x10);
          run_container_union((run_container_t *)ac,(run_container_t *)local_68,dst);
          local_71 = '\x03';
          dst_00 = (array_container_t *)convert_run_to_efficient_container(dst,&local_71);
        }
LAB_0011506b:
        uVar2 = local_71;
        extend_array(ra,1);
        iVar1 = ra->size;
        ra->keys[iVar1] = local_6e;
        ra->containers[iVar1] = dst_00;
        ra->typecodes[iVar1] = uVar2;
        ra->size = ra->size + 1;
        uVar9 = local_6c + 1;
        uVar14 = (uint)local_50;
        if ((uVar9 == uVar14) || ((int)local_40 == iVar12)) {
          uVar13 = (ulong)(iVar12 + 1);
LAB_0011518f:
          if (uVar9 == uVar14) {
LAB_00115193:
            bVar3 = (x2->high_low_container).flags;
            uVar9 = (uint)uVar13;
            uVar14 = (uint)local_58;
            sa = &x2->high_low_container;
          }
          else {
            if ((int)uVar13 != (int)local_58) {
              return (roaring_bitmap_t *)ra;
            }
            bVar3 = sa->flags;
          }
          ra_append_copy_range(ra,sa,uVar9,uVar14,(_Bool)(bVar3 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar13 = uVar13 + 1;
        puVar7 = (uint16_t *)((ulong)((uVar9 & 0xffff) * 2) + (long)sa->keys);
        uVar11 = (x2->high_low_container).keys[(uint)uVar13 & 0xffff];
        local_6c = uVar9;
      } while( true );
    }
  }
  prVar8 = roaring_bitmap_copy(prVar8);
  return prVar8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)
            ){
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2,
                                       &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}